

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QAbstractButton::timerEvent(QAbstractButton *this,QTimerEvent *e)

{
  QAbstractButtonPrivate *this_00;
  int *piVar1;
  
  this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
  if (*(TimerId *)(e + 0x10) == (this_00->repeatTimer).m_id) {
    QBasicTimer::start(&this_00->repeatTimer,(long)this_00->autoRepeatInterval * 1000000,1,this);
    if ((this_00->field_0x28c & 0x10) != 0) {
      piVar1 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
      (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this);
      if (piVar1 != (int *)0x0) {
        if (piVar1[1] != 0) {
          QAbstractButtonPrivate::emitReleased(this_00);
        }
        if (piVar1 != (int *)0x0) {
          if (piVar1[1] != 0) {
            QAbstractButtonPrivate::emitClicked(this_00);
          }
          if (piVar1 != (int *)0x0) {
            if (piVar1[1] != 0) {
              QAbstractButtonPrivate::emitPressed(this_00);
            }
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                operator_delete(piVar1);
                return;
              }
            }
          }
        }
      }
    }
  }
  else if (*(TimerId *)(e + 0x10) == (this_00->animateTimer).m_id) {
    QBasicTimer::stop();
    QAbstractButtonPrivate::click(this_00);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }